

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::InputFile::Data::fillBuffer
          (Data *this,ConstIterator to,int scanline1,int scanline2,int yStart,int xStart,int width)

{
  double dVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  char cVar8;
  ArgExc *this_00;
  ushort uVar9;
  long lVar10;
  ushort uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  float fVar15;
  ushort uVar16;
  uint fill;
  uint uVar17;
  float *pfVar18;
  float fill_2;
  float fVar19;
  
  if ((*(int *)((long)to._i._M_node + 0x140) == 1) && (*(int *)((long)to._i._M_node + 0x144) == 1))
  {
    if (scanline1 <= scanline2) {
      lVar4 = *(long *)((long)to._i._M_node + 0x130);
      dVar1 = *(double *)((long)to._i._M_node + 0x148);
      lVar14 = 0;
      if ((*(byte *)((long)to._i._M_node + 0x150) & 1) == 0) {
        lVar14 = xStart * lVar4;
      }
      lVar5 = *(long *)((long)to._i._M_node + 0x128);
      fVar19 = (float)dVar1;
      fVar15 = ABS(fVar19);
      uVar17 = (uint)fVar19 & 0x7fffff | 0x800000;
      cVar8 = (char)((uint)fVar19 >> 0x17);
      uVar11 = (ushort)((uint)fVar19 >> 0x10) & 0x8000;
      uVar12 = (uint)fVar19 >> 0xd & 0x3ff;
      uVar16 = (ushort)(uVar12 == 0) | (ushort)uVar12;
      uVar9 = uVar11 + 0x7c00;
      if ((uint)fVar15 < 0x477ff000) {
        uVar9 = (ushort)((int)fVar15 + 0x8000fff + (uint)(((uint)fVar15 >> 0xd & 1) != 0) >> 0xd) |
                uVar11;
      }
      if (fVar15 == INFINITY) {
        uVar16 = 0;
      }
      uVar16 = uVar11 + 0x7c00 + uVar16;
      if ((uint)fVar15 < 0x7f800000) {
        uVar16 = uVar9;
      }
      uVar9 = (ushort)(0x80000000 < uVar17 << (cVar8 + 0xa2U & 0x1f)) +
              ((ushort)(uVar17 >> (0x7eU - cVar8 & 0x1f)) | uVar11);
      if ((uint)fVar15 < 0x33000001) {
        uVar9 = uVar11;
      }
      iVar3 = *(int *)((long)to._i._M_node + 0x120);
      bVar2 = *(byte *)((long)to._i._M_node + 0x151);
      lVar6 = *(long *)((long)to._i._M_node + 0x138);
      if (0x387fffff < (uint)fVar15) {
        uVar9 = uVar16;
      }
      lVar10 = (long)scanline1;
      do {
        lVar7 = lVar10;
        if ((bVar2 & 1) != 0) {
          lVar7 = lVar10 - yStart;
        }
        pfVar18 = (float *)(lVar7 * lVar6 + lVar14 + lVar5);
        if (iVar3 == 2) {
          iVar13 = width;
          if (0 < width) {
            do {
              *pfVar18 = fVar19;
              pfVar18 = (float *)((long)pfVar18 + lVar4);
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
        }
        else if (iVar3 == 1) {
          iVar13 = width;
          if (0 < width) {
            do {
              *(ushort *)pfVar18 = uVar9;
              pfVar18 = (float *)((long)pfVar18 + lVar4);
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
        }
        else if ((iVar3 == 0) && (iVar13 = width, 0 < width)) {
          do {
            *pfVar18 = (float)(long)dVar1;
            pfVar18 = (float *)((long)pfVar18 + lVar4);
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
        }
        lVar10 = lVar10 + 1;
      } while (scanline2 + 1 != (int)lVar10);
    }
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,"Tiled data should not have subsampling.");
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
InputFile::Data::fillBuffer (FrameBuffer::ConstIterator to,
                             int scanline1, int scanline2,
                             int yStart, int xStart, int width)
{
    Slice toSlice = to.slice ();
    if (toSlice.xSampling != 1 || toSlice.ySampling != 1)
        throw IEX_NAMESPACE::ArgExc ("Tiled data should not have subsampling.");

    for (int y = scanline1; y <= scanline2; ++y)
    {
        char* toPtr = toSlice.base;

        if (toSlice.yTileCoords)
            toPtr += ( int64_t (y) - int64_t (yStart) ) * toSlice.yStride;
        else
            toPtr += int64_t (y) * toSlice.yStride;
        if (!toSlice.xTileCoords)
            toPtr += int64_t (xStart) * toSlice.xStride;

        //
        // Copy all pixels for the scanline in this row of tiles
        //

        switch (toSlice.type)
        {
            case UINT:
            {
                unsigned int fill =
                    static_cast<unsigned int> (toSlice.fillValue);
                for (int x = 0; x < width; ++x)
                {
                    *reinterpret_cast<unsigned int*> (toPtr) = fill;
                    toPtr += toSlice.xStride;
                }
                break;
            }
            case HALF:
            {
                half fill = toSlice.fillValue;
                for (int x = 0; x < width; ++x)
                {
                    *reinterpret_cast<half*> (toPtr) = fill;
                    toPtr += toSlice.xStride;
                }
                break;
            }
            case FLOAT:
            {
                float fill = toSlice.fillValue;
                for (int x = 0; x < width; ++x)
                {
                    *reinterpret_cast<float*> (toPtr) = fill;
                    toPtr += toSlice.xStride;
                }
                break;
            }
            case NUM_PIXELTYPES:
                break;
        }
    }
}